

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_>::alloc
          (array<CDoodadsMapper::CRule,_allocator_default<CDoodadsMapper::CRule>_> *this,int new_len
          )

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CRule *pCVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  CRule *pCVar8;
  long lVar9;
  ulong uVar10;
  
  this->list_size = new_len;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)new_len;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x28),8) == 0) {
    uVar10 = SUB168(auVar4 * ZEXT816(0x28),0);
  }
  pCVar8 = (CRule *)operator_new__(uVar10);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  pCVar3 = this->list;
  if (new_len < 1) {
    if (pCVar3 == (CRule *)0x0) goto LAB_00190fd8;
  }
  else {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)&pCVar8->m_HFlip + lVar9) =
           *(undefined8 *)((long)&pCVar3->m_HFlip + lVar9);
      puVar1 = (undefined8 *)((long)&(pCVar3->m_Rect).field_0 + lVar9);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pCVar3->m_RelativePos).field_0 + lVar9);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pCVar8->m_RelativePos).field_0 + lVar9);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      puVar1 = (undefined8 *)((long)&(pCVar8->m_Rect).field_0 + lVar9);
      *puVar1 = uVar5;
      puVar1[1] = uVar6;
      lVar9 = lVar9 + 0x28;
    } while ((ulong)(uint)new_len * 0x28 != lVar9);
  }
  operator_delete__(pCVar3);
  new_len = this->list_size;
  if (this->num_elements < this->list_size) {
    new_len = this->num_elements;
  }
LAB_00190fd8:
  this->num_elements = new_len;
  this->list = pCVar8;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}